

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_remove_listener_white_list_item(void)

{
  code *pcVar1;
  char *__s;
  SlbRemoveListenerWhiteListItemRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1d1;
  int ret;
  HttpTestListener *local_1b0;
  HttpTestListener *listener;
  string local_1a0;
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [55];
  allocator<char> local_119;
  string local_118 [32];
  SlbRemoveListenerWhiteListItemRequestType *local_f8;
  Slb *slb;
  undefined1 local_e8 [7];
  SlbRemoveListenerWhiteListItemResponseType resp;
  SlbRemoveListenerWhiteListItemRequestType req;
  
  aliyun::SlbRemoveListenerWhiteListItemRequestType::SlbRemoveListenerWhiteListItemRequestType
            ((SlbRemoveListenerWhiteListItemRequestType *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"cn-hangzhou",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_appid",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"my_secret",&local_179);
  pSVar2 = (SlbRemoveListenerWhiteListItemRequestType *)
           aliyun::Slb::CreateSlbClient(local_118,local_150,local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_f8 = pSVar2;
  if (pSVar2 == (SlbRemoveListenerWhiteListItemRequestType *)0x0) {
    aliyun::SlbRemoveListenerWhiteListItemRequestType::~SlbRemoveListenerWhiteListItemRequestType
              ((SlbRemoveListenerWhiteListItemRequestType *)local_e8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_f8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_remove_listener_white_list_item_response;
  local_1b0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1d1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1d1);
  HttpTestListener::Start(local_1b0);
  std::__cxx11::string::operator=((string *)local_e8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"LoadBalancerId");
  std::__cxx11::string::operator=
            ((string *)(req.load_balancer_id.field_2._M_local_buf + 8),"ListenerPort");
  std::__cxx11::string::operator=
            ((string *)(req.listener_port.field_2._M_local_buf + 8),"SourceItems");
  std::__cxx11::string::operator=
            ((string *)(req.source_items.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::RemoveListenerWhiteListItem
            (local_f8,(SlbRemoveListenerWhiteListItemResponseType *)local_e8,
             (SlbErrorInfo *)((long)&slb + 7));
  HttpTestListener::WaitComplete(local_1b0);
  pHVar3 = local_1b0;
  if (local_1b0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1b0);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_f8;
  if (local_f8 != (SlbRemoveListenerWhiteListItemRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_f8);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_remove_listener_white_list_item() {
  SlbRemoveListenerWhiteListItemRequestType req;
  SlbRemoveListenerWhiteListItemResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_remove_listener_white_list_item_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.load_balancer_id = "LoadBalancerId";
  req.listener_port = "ListenerPort";
  req.source_items = "SourceItems";
  req.owner_account = "OwnerAccount";
  int ret = slb->RemoveListenerWhiteListItem(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}